

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::TPZManVector
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int64_t *piVar3;
  int64_t iVar4;
  TPZTensor<TFad<6,_double>_> *pTVar5;
  ulong uVar6;
  long lVar7;
  TPZTensor<TFad<6,_double>_> *pTVar8;
  
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = (TPZTensor<TFad<6,_double>_> *)0x0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0189f620;
  pTVar5 = this->fExtAlloc;
  lVar7 = 0;
  pTVar8 = pTVar5;
  do {
    TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar8);
    lVar7 = lVar7 + -0x1a8;
    pTVar8 = pTVar8 + 1;
  } while (lVar7 != -0x4f8);
  if (size < 4) {
    iVar4 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    uVar2 = SUB168(auVar1 * ZEXT816(0x1a8),0);
    uVar6 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar6 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x1a8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    piVar3 = (int64_t *)operator_new__(uVar6);
    *piVar3 = size;
    pTVar5 = (TPZTensor<TFad<6,_double>_> *)(piVar3 + 1);
    lVar7 = 0;
    pTVar8 = pTVar5;
    do {
      TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar8);
      lVar7 = lVar7 + -0x1a8;
      pTVar8 = pTVar8 + 1;
      iVar4 = size;
    } while (size * -0x1a8 - lVar7 != 0);
  }
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = pTVar5;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = size;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = iVar4;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}